

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

string * getLinkedTargetsContent<cmLinkItem>
                   (string *__return_storage_ptr__,
                   vector<cmLinkItem,_std::allocator<cmLinkItem>_> *libraries,cmTarget *target,
                   cmTarget *headTarget,cmGeneratorExpressionContext *context,
                   cmGeneratorExpressionDAGChecker *dagChecker,string *interfacePropertyName)

{
  long *plVar1;
  pointer pcVar2;
  long *plVar3;
  size_type *psVar4;
  pointer pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string sep;
  string depString;
  string local_140;
  string *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  long *local_110 [2];
  long local_100 [2];
  undefined1 *local_f0;
  char *local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  cmGeneratorExpressionDAGChecker *local_50;
  cmGeneratorExpressionContext *local_48;
  cmTarget *local_40;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *local_38;
  
  local_118 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_118;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_f0 = &local_e0;
  local_e8 = (char *)0x0;
  local_e0 = 0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  pcVar5 = (libraries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = (libraries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_38 = libraries;
  if (pcVar5 != pcVar2) {
    local_120 = __return_storage_ptr__;
    local_50 = dagChecker;
    local_48 = context;
    local_40 = headTarget;
    do {
      if (pcVar5->Target != target && pcVar5->Target != (cmTarget *)0x0) {
        local_110[0] = local_100;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_110,local_f0,local_e8 + (long)local_f0);
        std::__cxx11::string::append((char *)local_110);
        plVar1 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_110,(ulong)(pcVar5->Target->Name)._M_dataplus._M_p
                                   );
        plVar3 = plVar1 + 2;
        if ((long *)*plVar1 == plVar3) {
          local_c0 = *plVar3;
          lStack_b8 = plVar1[3];
          local_d0 = &local_c0;
        }
        else {
          local_c0 = *plVar3;
          local_d0 = (long *)*plVar1;
        }
        local_c8 = plVar1[1];
        *plVar1 = (long)plVar3;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_d0);
        plVar3 = plVar1 + 2;
        if ((long *)*plVar1 == plVar3) {
          local_a0 = *plVar3;
          lStack_98 = plVar1[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar3;
          local_b0 = (long *)*plVar1;
        }
        local_a8 = plVar1[1];
        *plVar1 = (long)plVar3;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        plVar1 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_b0,
                                    (ulong)(interfacePropertyName->_M_dataplus)._M_p);
        plVar3 = plVar1 + 2;
        if ((long *)*plVar1 == plVar3) {
          local_80 = *plVar3;
          lStack_78 = plVar1[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar3;
          local_90 = (long *)*plVar1;
        }
        local_88 = plVar1[1];
        *plVar1 = (long)plVar3;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        psVar4 = (size_type *)(plVar1 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar1 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_140.field_2._M_allocated_capacity = *psVar4;
          local_140.field_2._8_8_ = plVar1[3];
        }
        else {
          local_140.field_2._M_allocated_capacity = *psVar4;
          local_140._M_dataplus._M_p = (pointer)*plVar1;
        }
        local_140._M_string_length = plVar1[1];
        *plVar1 = (long)psVar4;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_140._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,local_a0 + 1);
        }
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,local_c0 + 1);
        }
        if (local_110[0] != local_100) {
          operator_delete(local_110[0],local_100[0] + 1);
        }
        std::__cxx11::string::_M_replace((ulong)&local_f0,0,local_e8,0x4abead);
        pcVar2 = (local_38->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      __return_storage_ptr__ = local_120;
      pcVar5 = pcVar5 + 1;
    } while (pcVar5 != pcVar2);
    if (local_70._M_string_length != 0) {
      cmGeneratorExpressionNode::EvaluateDependentExpression
                (&local_140,&local_70,target->Makefile,local_48,local_40,target,local_50);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
    }
  }
  cmGeneratorExpression::StripEmptyListElements(&local_140,__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
getLinkedTargetsContent(
  std::vector<T> const &libraries,
  cmTarget const* target,
  cmTarget const* headTarget,
  cmGeneratorExpressionContext *context,
  cmGeneratorExpressionDAGChecker *dagChecker,
  const std::string &interfacePropertyName)
{
  std::string linkedTargetsContent;
  std::string sep;
  std::string depString;
  for (typename std::vector<T>::const_iterator it = libraries.begin();
       it != libraries.end(); ++it)
    {
    // Broken code can have a target in its own link interface.
    // Don't follow such link interface entries so as not to create a
    // self-referencing loop.
    if (it->Target && it->Target != target)
      {
      depString +=
        sep + "$<TARGET_PROPERTY:" +
        it->Target->GetName() + "," + interfacePropertyName + ">";
      sep = ";";
      }
    }
  if(!depString.empty())
    {
    linkedTargetsContent =
        cmGeneratorExpressionNode::EvaluateDependentExpression(depString,
                                        target->GetMakefile(), context,
                                        headTarget, target, dagChecker);
    }
  linkedTargetsContent =
    cmGeneratorExpression::StripEmptyListElements(linkedTargetsContent);
  return linkedTargetsContent;
}